

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O0

shared_ptr<IA> __thiscall Infector::Container::buildSingle_delegate<IA>(Container *this)

{
  IA *pIVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined4 extraout_var;
  pointer ppVar6;
  void *pvVar7;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Container *in_RSI;
  shared_ptr<IA> sVar8;
  shared_ptr<int> local_a0;
  shared_ptr<IA> local_90;
  exception *ex;
  type_index local_60;
  element_type *local_58;
  IA *myPointer;
  IAnyShared *any;
  iterator it3;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  local_38;
  iterator it2;
  type_index local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_20;
  iterator it;
  Container *this_local;
  
  std::type_index::type_index(&local_28,(type_info *)&IA::typeinfo);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::find(&in_RSI->typeMap,&local_28);
  it2.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
             )std::
              unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
              ::end(&in_RSI->typeMap);
  bVar2 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      *)&it2);
  if (bVar2) {
    launch_exception<Infector::ExBuildWhat>(in_RSI);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  if (((ppVar4->second).single & 1U) == 0) {
    launch_exception<Infector::ExSingleMulti>(in_RSI);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
       ::find(&in_RSI->callbacks,&(ppVar4->second).type);
  it3.super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>)
           std::
           unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
           ::end(&in_RSI->callbacks);
  bVar2 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                      *)&it3);
  if (bVar2) {
    launch_exception<Infector::ExNotWired>(in_RSI);
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  any = (IAnyShared *)
        std::
        unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
        ::find(&in_RSI->singleIstances,&(ppVar4->second).type);
  ppVar5 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
                       *)&any);
  pIVar1 = (IA *)ppVar5->second;
  myPointer = pIVar1;
  std::type_index::type_index(&local_60,(type_info *)&IA::typeinfo);
  iVar3 = (**pIVar1->_vptr_IA)(pIVar1,local_60._M_target);
  pIVar1 = myPointer;
  local_58 = (element_type *)CONCAT44(extraout_var,iVar3);
  if (local_58 == (element_type *)0x0) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
                           *)&local_38);
    pvVar7 = std::function<void_*(Infector::Container::EmplaceContext_*)>::operator()
                       (&ppVar6->second,(EmplaceContext *)0x0);
    (*pIVar1->_vptr_IA[1])(pIVar1,pvVar7);
    pIVar1 = myPointer;
    std::type_index::type_index((type_index *)&ex,(type_info *)&IA::typeinfo);
    iVar3 = (**pIVar1->_vptr_IA)(pIVar1,ex);
    local_58 = (element_type *)CONCAT44(extraout_var_00,iVar3);
  }
  if (local_58 == (element_type *)0x0) {
    launch_exception<Infector::ExAnySharedNullPtr>(in_RSI);
  }
  (*myPointer->_vptr_IA[2])(&local_a0);
  std::shared_ptr<IA>::shared_ptr<int>(&local_90,&local_a0,local_58);
  std::shared_ptr<IA>::shared_ptr((shared_ptr<IA> *)this,&local_90);
  std::shared_ptr<IA>::~shared_ptr(&local_90);
  std::shared_ptr<int>::~shared_ptr(&local_a0);
  sVar8.super___shared_ptr<IA,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar8.super___shared_ptr<IA,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<IA>)sVar8.super___shared_ptr<IA,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Container::buildSingle_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end()) //"it" is concrete type, T abstract one
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == false)
            launch_exception<ExSingleMulti>(); // T must be single

        //at this point may happen that concrete type and abstract ones are the
        //same.that's ok. (bindSingleAsNothing)
        auto it2 = callbacks.find(  it->second.type ); //find constructor

        if( it2==callbacks.end())
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        auto it3 = singleIstances.find( it->second.type );

        IAnyShared * any = it3->second;
        T* myPointer = reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );
        if(myPointer==nullptr){
            try{
                any->setPtr( (it2->second)(nullptr) );
                myPointer =  reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );

            }catch(std::exception & ex){
                throw ex;
            }catch(...){
                launch_exception<ExUnkownException>();
            }
        }

        if(myPointer == nullptr)
                launch_exception<ExAnySharedNullPtr>();

        return std::move(std::shared_ptr<T> (
                                any->getReferenceCounter(),
                                myPointer ));
    }